

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepLoop * __thiscall ON_BrepFace::Loop(ON_BrepFace *this,int lti)

{
  ON_Brep *this_00;
  int iVar1;
  int *piVar2;
  ON_BrepLoop *pOVar3;
  int lti_local;
  ON_BrepFace *this_local;
  
  if (((this->m_brep != (ON_Brep *)0x0) && (-1 < lti)) &&
     (iVar1 = ON_SimpleArray<int>::Count(&this->m_li), lti < iVar1)) {
    this_00 = this->m_brep;
    piVar2 = ON_SimpleArray<int>::operator[](&this->m_li,lti);
    pOVar3 = ON_Brep::Loop(this_00,*piVar2);
    return pOVar3;
  }
  return (ON_BrepLoop *)0x0;
}

Assistant:

ON_BrepLoop* ON_BrepFace::Loop( int lti ) const
{
  return (m_brep && lti >= 0 && lti < m_li.Count()) ? m_brep->Loop( m_li[lti]) : 0;
}